

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionCube<double,_1>::~EigenDecompositionCube
          (EigenDecompositionCube<double,_1> *this)

{
  long lVar1;
  
  (this->super_EigenDecomposition<double,_1>)._vptr_EigenDecomposition =
       (_func_int **)&PTR__EigenDecompositionCube_0014cce0;
  if (0 < (this->super_EigenDecomposition<double,_1>).kEigenDecompCount) {
    lVar1 = 0;
    do {
      free(this->gCMatrices[lVar1]);
      free((this->super_EigenDecomposition<double,_1>).gEigenValues[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->super_EigenDecomposition<double,_1>).kEigenDecompCount);
  }
  free(this->gCMatrices);
  free((this->super_EigenDecomposition<double,_1>).gEigenValues);
  free((this->super_EigenDecomposition<double,_1>).matrixTmp);
  free((this->super_EigenDecomposition<double,_1>).firstDerivTmp);
  free((this->super_EigenDecomposition<double,_1>).secondDerivTmp);
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::~EigenDecompositionCube() {

	for(int i=0; i<kEigenDecompCount; i++) {
		free(gCMatrices[i]);
		free(gEigenValues[i]);
	}
	free(gCMatrices);
	free(gEigenValues);
	free(matrixTmp);
	free(firstDerivTmp);
	free(secondDerivTmp);
}